

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_add_clienthello_tlsext
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_encoded,bool *out_needs_psk_binder,
               ssl_client_hello_type_t type,size_t header_len)

{
  SSL *pSVar1;
  bool bVar2;
  char cVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint8_t *puVar10;
  EVP_MD *md;
  undefined4 extraout_var;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  CBB extensions;
  CBB extensions_1;
  ScopedCBB outer_extensions;
  CBB extensions_encoded;
  CBB extension;
  ulong local_188;
  CBB local_168;
  SSL *local_138;
  bool *local_130;
  size_t local_128;
  CBB local_120;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  *out_needs_psk_binder = false;
  local_130 = out_needs_psk_binder;
  if (type != ssl_client_hello_inner) {
    if (out_encoded != (CBB *)0x0) {
      __assert_fail("out_encoded == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf22,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    pSVar1 = hs->ssl;
    iVar5 = CBB_add_u16_length_prefixed(out,&local_168);
    if (iVar5 == 0) {
      iVar5 = 0xf26;
    }
    else {
      (hs->extensions).sent = 0;
      local_138 = pSVar1;
      if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
        uVar4 = ssl_get_grease_value(hs,ssl_grease_extension1);
        bVar2 = add_padding_extension(&local_168,uVar4,0);
        if (!bVar2) {
          return false;
        }
      }
      bVar2 = false;
      bVar17 = false;
      uVar16 = 0;
      local_128 = header_len;
      do {
        uVar11 = (hs->extension_permutation).size_;
        uVar12 = uVar16;
        if (uVar11 != 0) {
          if (uVar11 <= uVar16) goto LAB_0013abe5;
          uVar12 = (ulong)(hs->extension_permutation).data_[uVar16];
        }
        sVar6 = CBB_len(&local_168);
        cVar3 = (**(code **)(&UNK_002f9108 + uVar12 * 0x28))(hs,&local_168,&local_168,type);
        if (cVar3 == '\0') {
          ERR_put_error(0x10,0,0x93,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xf3d);
          ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[uVar12 * 0x14]);
        }
        else {
          sVar7 = CBB_len(&local_168);
          if (sVar7 != sVar6) {
            (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)uVar12 & 0x1f);
          }
          bVar2 = sVar7 - sVar6 == 4;
        }
        sVar6 = local_128;
        if (cVar3 == '\0') break;
        bVar17 = 0x1a < uVar16;
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x1c);
      if (!bVar17) {
        return false;
      }
      if ((((local_138->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
        uVar4 = ssl_get_grease_value(hs,ssl_grease_extension2);
        bVar17 = add_padding_extension(&local_168,uVar4,1);
        bVar2 = false;
        if (!bVar17) {
          return false;
        }
      }
      pSVar1 = hs->ssl;
      bVar17 = should_offer_psk(hs,type);
      if (bVar17) {
        md = (EVP_MD *)
             ssl_session_get_digest
                       ((pSVar1->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        iVar5 = EVP_MD_size(md);
        lVar15 = CONCAT44(extraout_var,iVar5) +
                 *(size_t *)
                  ((long)&((pSVar1->session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ticket + 8)
                 + 0xf;
      }
      else {
        lVar15 = 0;
      }
      pSVar1 = local_138;
      iVar5 = SSL_is_dtls(local_138);
      if (((iVar5 == 0) && (iVar5 = SSL_is_quic(pSVar1), iVar5 == 0)) &&
         ((pSVar1->s3->field_0xdd & 0x10) == 0)) {
        sVar7 = CBB_len(&local_168);
        lVar13 = sVar6 + lVar15;
        uVar11 = sVar7 + lVar13 + 6;
        bVar14 = lVar15 == 0 & bVar2;
        uVar16 = sVar7 + 0xb + lVar13;
        if (bVar14 == 0) {
          uVar16 = uVar11;
        }
        sVar6 = 1;
        if (uVar11 < 0x1fc) {
          sVar6 = 0x1f6 - (sVar7 + lVar13);
        }
        if ((uVar16 & 0xffffffffffffff00) != 0x100) {
          sVar6 = (ulong)bVar14;
        }
        if ((sVar6 != 0) && (bVar2 = add_padding_extension(&local_168,0x15,sVar6), !bVar2)) {
          return false;
        }
      }
      sVar6 = CBB_len(&local_168);
      bVar2 = ext_pre_shared_key_add_clienthello(hs,&local_168,local_130,type);
      if (bVar2) {
        sVar7 = CBB_len(&local_168);
        if (lVar15 != sVar7 - sVar6) {
          __assert_fail("psk_extension_len == CBB_len(&extensions) - len_before",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xf8a,
                        "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                       );
        }
        sVar6 = CBB_len(&local_168);
        if (sVar6 == 0) {
          CBB_discard_child(out);
        }
        iVar5 = CBB_flush(out);
        return iVar5 != 0;
      }
      iVar5 = 0xf87;
    }
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,iVar5);
    return false;
  }
  pSVar1 = hs->ssl;
  CBB_zero(&local_168);
  CBB_zero(&local_f0);
  iVar5 = CBB_add_u16_length_prefixed(out,&local_120);
  if (((iVar5 == 0) || (iVar5 = CBB_add_u16_length_prefixed(out_encoded,&local_c0), iVar5 == 0)) ||
     ((iVar5 = CBB_init(&local_168,0x40), iVar5 == 0 ||
      (iVar5 = CBB_init(&local_f0,0x40), iVar5 == 0)))) {
    bVar2 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xeba);
    goto LAB_0013aa2b;
  }
  hs->inner_extensions_sent = 0;
  if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) == 0) {
LAB_0013a4f1:
    uVar16 = 0;
    do {
      uVar11 = (hs->extension_permutation).size_;
      local_188 = uVar16;
      if (uVar11 != 0) {
        if (uVar11 <= uVar16) {
LAB_0013abe5:
          abort();
        }
        local_188 = (ulong)(hs->extension_permutation).data_[uVar16];
      }
      sVar6 = CBB_len(&local_120);
      sVar7 = CBB_len(&local_168);
      cVar3 = (**(code **)(&UNK_002f9108 + local_188 * 0x28))(hs,&local_120,&local_168,1);
      if (cVar3 == '\0') {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xed2);
        bVar2 = false;
        ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[local_188 * 0x14]);
        goto LAB_0013aa2b;
      }
      sVar8 = CBB_len(&local_120);
      sVar9 = CBB_len(&local_168);
      if (sVar9 != sVar7 && sVar8 != sVar6) {
        __assert_fail("bytes_written == 0 || bytes_written_compressed == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xedb,
                      "bool bssl::ssl_add_clienthello_tlsext_inner(SSL_HANDSHAKE *, CBB *, CBB *, bool *)"
                     );
      }
      if (sVar9 != sVar7 || sVar8 != sVar6) {
        hs->inner_extensions_sent = hs->inner_extensions_sent | 1 << ((byte)local_188 & 0x1f);
      }
      if ((sVar9 != sVar7) &&
         (iVar5 = CBB_add_u16(&local_f0,(&kExtensions)[local_188 * 0x14]), iVar5 == 0))
      goto LAB_0013aa6c;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x1c);
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar4 = ssl_get_grease_value(hs,ssl_grease_extension2);
      bVar2 = add_padding_extension(&local_168,uVar4,1);
      if ((!bVar2) || (iVar5 = CBB_add_u16(&local_f0,uVar4), iVar5 == 0)) goto LAB_0013aa6c;
    }
    puVar10 = CBB_data(&local_120);
    sVar6 = CBB_len(&local_120);
    iVar5 = CBB_add_bytes(&local_c0,puVar10,sVar6);
    if (iVar5 != 0) {
      sVar6 = CBB_len(&local_168);
      if (sVar6 == 0) {
LAB_0013a776:
        sVar6 = CBB_len(&local_120);
        bVar2 = ext_pre_shared_key_add_clienthello(hs,&local_120,local_130,ssl_client_hello_inner);
        if (bVar2) {
          puVar10 = CBB_data(&local_120);
          sVar7 = CBB_len(&local_120);
          iVar5 = CBB_add_bytes(&local_c0,puVar10 + sVar6,sVar7 - sVar6);
          if ((iVar5 != 0) && (iVar5 = CBB_flush(out), iVar5 != 0)) {
            iVar5 = CBB_flush(out_encoded);
            bVar2 = iVar5 != 0;
            goto LAB_0013aa2b;
          }
        }
      }
      else {
        puVar10 = CBB_data(&local_168);
        sVar6 = CBB_len(&local_168);
        iVar5 = CBB_add_bytes(&local_120,puVar10,sVar6);
        if ((((iVar5 != 0) && (iVar5 = CBB_add_u16(&local_c0,0xfd00), iVar5 != 0)) &&
            (iVar5 = CBB_add_u16_length_prefixed(&local_c0,&local_60), iVar5 != 0)) &&
           (iVar5 = CBB_add_u8_length_prefixed(&local_60,&local_90), iVar5 != 0)) {
          puVar10 = CBB_data(&local_f0);
          sVar6 = CBB_len(&local_f0);
          iVar5 = CBB_add_bytes(&local_90,puVar10,sVar6);
          if ((iVar5 != 0) && (iVar5 = CBB_flush(&local_c0), iVar5 != 0)) goto LAB_0013a776;
        }
      }
    }
  }
  else {
    uVar4 = ssl_get_grease_value(hs,ssl_grease_extension1);
    bVar2 = add_padding_extension(&local_168,uVar4,0);
    if ((bVar2) && (iVar5 = CBB_add_u16(&local_f0,uVar4), iVar5 != 0)) goto LAB_0013a4f1;
  }
LAB_0013aa6c:
  bVar2 = false;
LAB_0013aa2b:
  CBB_cleanup(&local_f0);
  CBB_cleanup(&local_168);
  return bVar2;
}

Assistant:

bool ssl_add_clienthello_tlsext(SSL_HANDSHAKE *hs, CBB *out, CBB *out_encoded,
                                bool *out_needs_psk_binder,
                                ssl_client_hello_type_t type,
                                size_t header_len) {
  *out_needs_psk_binder = false;

  if (type == ssl_client_hello_inner) {
    return ssl_add_clienthello_tlsext_inner(hs, out, out_encoded,
                                            out_needs_psk_binder);
  }

  assert(out_encoded == nullptr);  // Only ClientHelloInner needs two outputs.
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Note we may send multiple ClientHellos for DTLS HelloVerifyRequest and TLS
  // 1.3 HelloRetryRequest. For the latter, the extensions may change, so it is
  // important to reset this value.
  hs->extensions.sent = 0;

  // Add a fake empty extension. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !add_padding_extension(
          &extensions, ssl_get_grease_value(hs, ssl_grease_extension1), 0)) {
    return false;
  }

  bool last_was_empty = false;
  for (size_t unpermuted = 0; unpermuted < kNumExtensions; unpermuted++) {
    size_t i = hs->extension_permutation.empty()
                   ? unpermuted
                   : hs->extension_permutation[unpermuted];
    const size_t len_before = CBB_len(&extensions);
    if (!kExtensions[i].add_clienthello(hs, &extensions, &extensions, type)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      return false;
    }

    const size_t bytes_written = CBB_len(&extensions) - len_before;
    if (bytes_written != 0) {
      hs->extensions.sent |= (1u << i);
    }
    // If the difference in lengths is only four bytes then the extension had
    // an empty body.
    last_was_empty = (bytes_written == 4);
  }

  if (ssl->ctx->grease_enabled) {
    // Add a fake non-empty extension. See RFC 8701.
    if (!add_padding_extension(
            &extensions, ssl_get_grease_value(hs, ssl_grease_extension2), 1)) {
      return false;
    }
    last_was_empty = false;
  }

  // In cleartext ClientHellos, we add the padding extension to work around
  // bugs. We also apply this padding to ClientHelloOuter, to keep the wire
  // images aligned.
  size_t psk_extension_len = ext_pre_shared_key_clienthello_length(hs, type);
  if (!SSL_is_dtls(ssl) && !SSL_is_quic(ssl) &&
      !ssl->s3->used_hello_retry_request) {
    header_len +=
        SSL3_HM_HEADER_LENGTH + 2 + CBB_len(&extensions) + psk_extension_len;
    size_t padding_len = 0;

    // The final extension must be non-empty. WebSphere Application
    // Server 7.0 is intolerant to the last extension being zero-length. See
    // https://crbug.com/363583.
    if (last_was_empty && psk_extension_len == 0) {
      padding_len = 1;
      // The addition of the padding extension may push us into the F5 bug.
      header_len += 4 + padding_len;
    }

    // Add padding to workaround bugs in F5 terminators. See RFC 7685.
    //
    // NB: because this code works out the length of all existing extensions
    // it MUST always appear last (save for any PSK extension).
    if (header_len > 0xff && header_len < 0x200) {
      // If our calculations already included a padding extension, remove that
      // factor because we're about to change its length.
      if (padding_len != 0) {
        header_len -= 4 + padding_len;
      }
      padding_len = 0x200 - header_len;
      // Extensions take at least four bytes to encode. Always include at least
      // one byte of data if including the extension. WebSphere Application
      // Server 7.0 is intolerant to the last extension being zero-length. See
      // https://crbug.com/363583.
      if (padding_len >= 4 + 1) {
        padding_len -= 4;
      } else {
        padding_len = 1;
      }
    }

    if (padding_len != 0 &&
        !add_padding_extension(&extensions, TLSEXT_TYPE_padding, padding_len)) {
      return false;
    }
  }

  // The PSK extension must be last, including after the padding.
  const size_t len_before = CBB_len(&extensions);
  if (!ext_pre_shared_key_add_clienthello(hs, &extensions, out_needs_psk_binder,
                                          type)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  assert(psk_extension_len == CBB_len(&extensions) - len_before);
  (void)len_before;  // |assert| is omitted in release builds.

  // Discard empty extensions blocks.
  if (CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);
}